

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::flatten(CodeHolder *this)

{
  unsigned_long uVar1;
  long lVar2;
  unsigned_long uVar3;
  Error EVar4;
  unsigned_long *in_RDI;
  uint64_t realSize_1;
  Section *section_1;
  iterator __end2_1;
  iterator __begin2_1;
  ZoneVector<asmjit::v1_14::Section_*> *__range2_1;
  Section *prev;
  FastUInt8 of;
  uint64_t alignedOffset;
  uint64_t realSize;
  Section *section;
  iterator __end2;
  iterator __begin2;
  ZoneVector<asmjit::v1_14::Section_*> *__range2;
  uint64_t offset;
  ulong local_188;
  FastUInt8 *of_00;
  unsigned_long *in_stack_fffffffffffffe90;
  long *local_158;
  long local_148;
  long *local_118;
  ulong local_108;
  FastUInt8 *local_98;
  FastUInt8 *local_90;
  long local_88;
  uint local_6c;
  ulong local_68;
  long local_58;
  long local_50;
  long local_40;
  long local_38;
  FastUInt8 **local_20;
  FastUInt8 **local_18;
  
  local_108 = 0;
  local_118 = (long *)in_RDI[0x1d];
  uVar1 = in_RDI[0x1d];
  uVar3 = in_RDI[0x1e];
  do {
    if (local_118 == (long *)(uVar1 + (ulong)(uint)uVar3 * 8)) {
      local_148 = 0;
      local_108 = 0;
      uVar1 = in_RDI[0x1d];
      uVar3 = in_RDI[0x1e];
      for (local_158 = (long *)in_RDI[0x1d]; local_158 != (long *)(uVar1 + (ulong)(uint)uVar3 * 8);
          local_158 = local_158 + 1) {
        lVar2 = *local_158;
        local_188 = *(ulong *)(lVar2 + 0x18);
        if (local_188 < *(ulong *)(lVar2 + 0x50)) {
          local_188 = *(ulong *)(lVar2 + 0x50);
        }
        if (local_188 != 0) {
          local_108 = local_108 + ((ulong)*(uint *)(lVar2 + 8) - 1) &
                      ((ulong)*(uint *)(lVar2 + 8) - 1 ^ 0xffffffffffffffff);
        }
        *(ulong *)(lVar2 + 0x10) = local_108;
        if (local_148 != 0) {
          *(ulong *)(local_148 + 0x18) = local_108 - *(long *)(local_148 + 0x10);
        }
        local_108 = local_188 + local_108;
        local_148 = lVar2;
      }
      return 0;
    }
    local_88 = *local_118;
    local_90 = *(FastUInt8 **)(local_88 + 0x18);
    local_38 = local_88 + 0x48;
    local_98 = *(FastUInt8 **)(local_88 + 0x50);
    local_18 = &local_90;
    local_20 = &local_98;
    of_00 = local_90;
    if (local_90 < local_98) {
      of_00 = local_98;
    }
    if (of_00 != (FastUInt8 *)0x0) {
      local_6c = *(uint *)(local_88 + 8);
      local_68 = local_108;
      local_58 = local_88;
      local_50 = local_88;
      local_40 = local_88;
      if ((local_108 + ((ulong)local_6c - 1) & ((ulong)local_6c - 1 ^ 0xffffffffffffffff)) <
          local_108) {
        EVar4 = DebugUtils::errored(9);
        return EVar4;
      }
      local_108 = Support::addOverflow<unsigned_long>(in_stack_fffffffffffffe90,in_RDI,of_00);
    }
    local_118 = local_118 + 1;
  } while( true );
}

Assistant:

Error CodeHolder::flatten() noexcept {
  uint64_t offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      if (ASMJIT_UNLIKELY(alignedOffset < offset))
        return DebugUtils::errored(kErrorTooLarge);

      Support::FastUInt8 of = 0;
      offset = Support::addOverflow(alignedOffset, realSize, &of);

      if (ASMJIT_UNLIKELY(of))
        return DebugUtils::errored(kErrorTooLarge);
    }
  }

  // Now we know that we can assign offsets of all sections properly.
  Section* prev = nullptr;
  offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize)
      offset = Support::alignUp(offset, section->alignment());
    section->_offset = offset;

    // Make sure the previous section extends a bit to cover the alignment.
    if (prev)
      prev->_virtualSize = offset - prev->_offset;

    prev = section;
    offset += realSize;
  }

  return kErrorOk;
}